

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O0

RealType __thiscall OpenMD::ChargeField::getValue(ChargeField *this,StuntDouble *sd)

{
  bool bVar1;
  AtomType *AT;
  Atom *in_RSI;
  RealType RVar2;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  AtomType *atomType;
  Atom *atom;
  RealType charge;
  FluctuatingChargeAdapter FStack_38;
  FixedChargeAdapter in_stack_ffffffffffffffd0;
  double local_18;
  
  local_18 = 0.0;
  AT = Atom::getAtomType(in_RSI);
  FixedChargeAdapter::FixedChargeAdapter((FixedChargeAdapter *)&stack0xffffffffffffffd0,AT);
  bVar1 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x172b39);
  if (bVar1) {
    local_18 = FixedChargeAdapter::getCharge((FixedChargeAdapter *)in_stack_ffffffffffffffd0.at_);
  }
  FluctuatingChargeAdapter::FluctuatingChargeAdapter(&FStack_38,AT);
  bVar1 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x172b64);
  if (bVar1) {
    RVar2 = StuntDouble::getFlucQPos((StuntDouble *)in_stack_ffffffffffffffd0.at_);
    local_18 = RVar2 + local_18;
  }
  return local_18;
}

Assistant:

RealType ChargeField::getValue(StuntDouble* sd) {
    RealType charge = 0.0;
    Atom* atom      = static_cast<Atom*>(sd);

    AtomType* atomType = atom->getAtomType();

    FixedChargeAdapter fca = FixedChargeAdapter(atomType);
    if (fca.isFixedCharge()) { charge = fca.getCharge(); }

    FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
    if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(); }
    return charge;
  }